

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int stb_vorbis_decode_memory(uint8 *mem,int len,int *channels,int *sample_rate,short **output)

{
  uint uVar1;
  int iVar2;
  stb_vorbis *f;
  short *buffer;
  int num_shorts;
  int iVar3;
  int num_c;
  short *__ptr;
  int iVar4;
  ulong uVar5;
  int error;
  int local_34;
  
  f = stb_vorbis_open_memory(mem,len,&local_34,(stb_vorbis_alloc *)0x0);
  if (f == (stb_vorbis *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = f->channels;
    *channels = iVar3;
    uVar5 = (long)iVar3 << 0xc;
    if (sample_rate != (int *)0x0) {
      *sample_rate = f->sample_rate;
    }
    buffer = (short *)malloc((long)iVar3 * 0x2000);
    iVar3 = -2;
    if (buffer != (short *)0x0) {
      num_shorts = (int)uVar5;
      iVar2 = stb_vorbis_get_frame_short_interleaved(f,f->channels,buffer,num_shorts);
      if (iVar2 == 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = 0;
        iVar4 = 0;
        uVar5 = uVar5 & 0xffffffff;
        __ptr = buffer;
        do {
          num_c = f->channels;
          iVar4 = num_c * iVar2 + iVar4;
          buffer = __ptr;
          if ((int)uVar5 < num_shorts + iVar4) {
            uVar1 = (int)uVar5 * 2;
            uVar5 = (ulong)uVar1;
            buffer = (short *)realloc(__ptr,(long)(int)uVar1 * 2);
            if (buffer == (short *)0x0) {
              free(__ptr);
              iVar3 = -2;
              goto LAB_001815c4;
            }
            num_c = f->channels;
          }
          iVar3 = iVar3 + iVar2;
          iVar2 = stb_vorbis_get_frame_short_interleaved(f,num_c,buffer + iVar4,(int)uVar5 - iVar4);
          __ptr = buffer;
        } while (iVar2 != 0);
      }
      *output = buffer;
    }
LAB_001815c4:
    stb_vorbis_close(f);
  }
  return iVar3;
}

Assistant:

int stb_vorbis_decode_memory(const uint8 *mem, int len, int *channels, int *sample_rate, short **output)
{
   int data_len, offset, total, limit, error;
   short *data;
   stb_vorbis *v = stb_vorbis_open_memory(mem, len, &error, NULL);
   if (v == NULL) return -1;
   limit = v->channels * 4096;
   *channels = v->channels;
   if (sample_rate)
      *sample_rate = v->sample_rate;
   offset = data_len = 0;
   total = limit;
   data = (short *) malloc(total * sizeof(*data));
   if (data == NULL) {
      stb_vorbis_close(v);
      return -2;
   }
   for (;;) {
      int n = stb_vorbis_get_frame_short_interleaved(v, v->channels, data+offset, total-offset);
      if (n == 0) break;
      data_len += n;
      offset += n * v->channels;
      if (offset + limit > total) {
         short *data2;
         total *= 2;
         data2 = (short *) realloc(data, total * sizeof(*data));
         if (data2 == NULL) {
            free(data);
            stb_vorbis_close(v);
            return -2;
         }
         data = data2;
      }
   }
   *output = data;
   stb_vorbis_close(v);
   return data_len;
}